

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O2

void testB44Table(string *param_1)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  char *func;
  uint16_t uVar3;
  char *pcVar4;
  long lVar5;
  float fVar6;
  
  lVar5 = _imath_half_to_float_table;
  puVar2 = exrcore_expTable;
  pcVar4 = (char *)0x0;
  do {
    if (pcVar4 == (char *)0x10000) goto LAB_00114157;
    if ((~(uint)pcVar4 & 0x7c00) == 0) {
      uVar3 = 0;
    }
    else {
      fVar6 = *(float *)(lVar5 + (long)pcVar4 * 4);
      uVar3 = 0x7bff;
      if (fVar6 < 88.71893) {
        fVar6 = expf(fVar6 * 0.125);
        uVar3 = imath_float_to_half(fVar6);
      }
    }
    func = pcVar4 + 1;
    puVar1 = puVar2 + (long)pcVar4;
    pcVar4 = func;
  } while (*puVar1 == uVar3);
  core_test_fail("exrcore_expTable[i] == h.bits ()",(char *)0x634,0x317226,func);
LAB_00114157:
  lVar5 = 0;
  do {
    if (lVar5 == 0x10000) {
      return;
    }
    if (((~(uint)lVar5 & 0x7c00) == 0) ||
       (fVar6 = *(float *)(_imath_half_to_float_table + lVar5 * 4), fVar6 < 0.0)) {
      uVar3 = 0;
    }
    else {
      fVar6 = logf(fVar6);
      uVar3 = imath_float_to_half(fVar6 * 8.0);
    }
    puVar2 = exrcore_logTable + lVar5;
    lVar5 = lVar5 + 1;
  } while (*puVar2 == uVar3);
  core_test_fail("exrcore_logTable[i] == h.bits ()",(char *)0x641,0x317226,(char *)exrcore_logTable)
  ;
  return;
}

Assistant:

void
testB44Table (const std::string&)
{
    const int iMax = (1 << 16);

    for (int i = 0; i < iMax; i++)
    {
        half h;
        h.setBits (i);

        if (!h.isFinite ())
            h = 0;
        else if (h >= 8 * log (HALF_MAX))
            h = HALF_MAX;
        else
            h = exp (h / 8);

        EXRCORE_TEST (exrcore_expTable[i] == h.bits ());
    }

    for (int i = 0; i < iMax; i++)
    {
        half h;
        h.setBits (i);

        if (!h.isFinite () || h < 0)
            h = 0;
        else
            h = 8 * log (h);

        EXRCORE_TEST (exrcore_logTable[i] == h.bits ());
    }
}